

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_0::CurrentVertexAttribFloatCase::test
          (CurrentVertexAttribFloatCase *this)

{
  CallLogWrapper *this_00;
  GLuint GVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int attribute_count;
  Random rnd;
  GLint local_3c;
  GLfloat local_38;
  GLfloat local_34;
  deRandom local_30;
  
  deRandom_init(&local_30,0xabcdef);
  local_3c = 0x10;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8869,&local_3c);
  if (0 < local_3c) {
    GVar1 = 0;
    do {
      fVar2 = deRandom_getFloat(&local_30);
      fVar4 = fVar2 * 128000.0 + -64000.0;
      fVar2 = deRandom_getFloat(&local_30);
      fVar2 = fVar2 * 128000.0 + -64000.0;
      fVar3 = deRandom_getFloat(&local_30);
      local_38 = fVar3 * 128000.0 + -64000.0;
      fVar3 = deRandom_getFloat(&local_30);
      local_34 = fVar3 * 128000.0 + -64000.0;
      glu::CallLogWrapper::glVertexAttrib4f(this_00,GVar1,fVar4,fVar2,local_38,local_34);
      verifyCurrentVertexAttribf
                ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 this_00,GVar1,fVar4,fVar2,local_38,local_34);
      GVar1 = GVar1 + 1;
    } while ((int)GVar1 < local_3c);
  }
  if (0 < local_3c) {
    GVar1 = 0;
    do {
      fVar2 = deRandom_getFloat(&local_30);
      fVar4 = fVar2 * 128000.0 + -64000.0;
      fVar2 = deRandom_getFloat(&local_30);
      fVar2 = fVar2 * 128000.0 + -64000.0;
      fVar3 = deRandom_getFloat(&local_30);
      local_38 = fVar3 * 128000.0 + -64000.0;
      glu::CallLogWrapper::glVertexAttrib3f(this_00,GVar1,fVar4,fVar2,local_38);
      verifyCurrentVertexAttribf
                ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 this_00,GVar1,fVar4,fVar2,local_38,1.0);
      GVar1 = GVar1 + 1;
    } while ((int)GVar1 < local_3c);
  }
  if (0 < local_3c) {
    GVar1 = 0;
    do {
      fVar2 = deRandom_getFloat(&local_30);
      fVar3 = fVar2 * 128000.0 + -64000.0;
      fVar2 = deRandom_getFloat(&local_30);
      fVar2 = fVar2 * 128000.0 + -64000.0;
      glu::CallLogWrapper::glVertexAttrib2f(this_00,GVar1,fVar3,fVar2);
      verifyCurrentVertexAttribf
                ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 this_00,GVar1,fVar3,fVar2,0.0,1.0);
      GVar1 = GVar1 + 1;
    } while ((int)GVar1 < local_3c);
  }
  if (0 < local_3c) {
    GVar1 = 0;
    do {
      fVar2 = deRandom_getFloat(&local_30);
      fVar2 = fVar2 * 128000.0 + -64000.0;
      glu::CallLogWrapper::glVertexAttrib1f(this_00,GVar1,fVar2);
      verifyCurrentVertexAttribf
                ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 this_00,GVar1,fVar2,0.0,0.0,1.0);
      GVar1 = GVar1 + 1;
    } while ((int)GVar1 < local_3c);
  }
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		de::Random rnd(0xabcdef);

		int attribute_count = 16;
		glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &attribute_count);

		// test write float/read float

		for (int index = 0; index < attribute_count; ++index)
		{
			const GLfloat x = rnd.getFloat(-64000, 64000);
			const GLfloat y = rnd.getFloat(-64000, 64000);
			const GLfloat z = rnd.getFloat(-64000, 64000);
			const GLfloat w = rnd.getFloat(-64000, 64000);

			glVertexAttrib4f(index, x, y, z, w);
			verifyCurrentVertexAttribf(m_testCtx, *this, index, x, y, z, w);
		}
		for (int index = 0; index < attribute_count; ++index)
		{
			const GLfloat x = rnd.getFloat(-64000, 64000);
			const GLfloat y = rnd.getFloat(-64000, 64000);
			const GLfloat z = rnd.getFloat(-64000, 64000);
			const GLfloat w = 1.0f;

			glVertexAttrib3f(index, x, y, z);
			verifyCurrentVertexAttribf(m_testCtx, *this, index, x, y, z, w);
		}
		for (int index = 0; index < attribute_count; ++index)
		{
			const GLfloat x = rnd.getFloat(-64000, 64000);
			const GLfloat y = rnd.getFloat(-64000, 64000);
			const GLfloat z = 0.0f;
			const GLfloat w = 1.0f;

			glVertexAttrib2f(index, x, y);
			verifyCurrentVertexAttribf(m_testCtx, *this, index, x, y, z, w);
		}
		for (int index = 0; index < attribute_count; ++index)
		{
			const GLfloat x = rnd.getFloat(-64000, 64000);
			const GLfloat y = 0.0f;
			const GLfloat z = 0.0f;
			const GLfloat w = 1.0f;

			glVertexAttrib1f(index, x);
			verifyCurrentVertexAttribf(m_testCtx, *this, index, x, y, z, w);
		}
	}